

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void setup_call_hard_reg_args(gen_ctx_t gen_ctx,MIR_insn_t call_insn,MIR_reg_t hard_reg)

{
  void *pvVar1;
  int iVar2;
  bitmap_t pVVar3;
  insn_data_t insn_data;
  MIR_reg_t hard_reg_local;
  MIR_insn_t call_insn_local;
  gen_ctx_t gen_ctx_local;
  
  iVar2 = MIR_call_code_p((MIR_insn_code_t)*(undefined8 *)&call_insn->field_0x18);
  if ((iVar2 != 0) && (hard_reg < 0x22)) {
    if (gen_ctx->optimize_level == 0) {
      pvVar1 = call_insn->data;
      if (*(long *)((long)pvVar1 + 8) == 0) {
        pVVar3 = bitmap_create2(0x22);
        *(bitmap_t *)((long)pvVar1 + 8) = pVVar3;
      }
      bitmap_set_bit_p(*(bitmap_t *)((long)pvVar1 + 8),(ulong)hard_reg);
    }
    else {
      bitmap_set_bit_p(*(bitmap_t *)((long)call_insn->data + 0x48),(ulong)hard_reg);
    }
    return;
  }
  __assert_fail("MIR_call_code_p (call_insn->code) && hard_reg <= ST1_HARD_REG",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x2d0,"void setup_call_hard_reg_args(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
}

Assistant:

static void MIR_UNUSED setup_call_hard_reg_args (gen_ctx_t gen_ctx, MIR_insn_t call_insn,
                                                 MIR_reg_t hard_reg) {
  insn_data_t insn_data;

  gen_assert (MIR_call_code_p (call_insn->code) && hard_reg <= MAX_HARD_REG);
  if (optimize_level != 0) {
    bitmap_set_bit_p (((bb_insn_t) call_insn->data)->call_hard_reg_args, hard_reg);
    return;
  }
  if ((insn_data = call_insn->data)->u.call_hard_reg_args == NULL)
    insn_data->u.call_hard_reg_args = (void *) bitmap_create2 (MAX_HARD_REG + 1);
  bitmap_set_bit_p (insn_data->u.call_hard_reg_args, hard_reg);
}